

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::addMatcher
          (AffixPatternMatcherBuilder *this,NumberParseMatcher *matcher)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  NumberParseMatcher **__dest;
  uint uVar5;
  
  uVar1 = this->fMatchersLen;
  if (((this->fMatchers).capacity <= (int)uVar1) && (0 < (int)uVar1)) {
    uVar4 = uVar1 * 2;
    __dest = (NumberParseMatcher **)uprv_malloc_63((ulong)uVar4 << 3);
    if (__dest != (NumberParseMatcher **)0x0) {
      uVar2 = (this->fMatchers).capacity;
      uVar5 = uVar1;
      if ((int)uVar2 < (int)uVar1) {
        uVar5 = uVar2;
      }
      if (SBORROW4(uVar5,uVar4) == (int)(uVar5 + uVar1 * -2) < 0) {
        uVar5 = uVar4;
      }
      memcpy(__dest,(this->fMatchers).ptr,(long)(int)uVar5 << 3);
      if ((this->fMatchers).needToRelease != '\0') {
        uprv_free_63((this->fMatchers).ptr);
      }
      (this->fMatchers).ptr = __dest;
      (this->fMatchers).capacity = uVar4;
      (this->fMatchers).needToRelease = '\x01';
    }
  }
  iVar3 = this->fMatchersLen;
  this->fMatchersLen = iVar3 + 1;
  (this->fMatchers).ptr[iVar3] = matcher;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::addMatcher(NumberParseMatcher& matcher) {
    if (fMatchersLen >= fMatchers.getCapacity()) {
        fMatchers.resize(fMatchersLen * 2, fMatchersLen);
    }
    fMatchers[fMatchersLen++] = &matcher;
}